

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int print_tmat(char *fn)

{
  int iVar1;
  cmd_ln_t *cmdln;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  uint32 n_state_pm;
  uint32 n_tmat;
  float local_44;
  float32 ***tmat;
  long local_38;
  
  cmdln = cmd_ln_get();
  lVar2 = cmd_ln_int_r(cmdln,"-norm");
  pcVar4 = " and normalizing.";
  if ((int)lVar2 == 0) {
    pcVar4 = ".";
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x16c,"Reading %s%s\n",pcVar4,fn);
  iVar1 = s3tmat_read(fn,&tmat,&n_tmat,&n_state_pm);
  if (iVar1 == 0) {
    printf("tmat %u %u\n",(ulong)n_tmat,(ulong)n_state_pm);
    local_38 = lVar2;
    for (uVar6 = 0; uVar6 < n_tmat; uVar6 = uVar6 + 1) {
      printf("tmat [%u]\n",uVar6 & 0xffffffff);
      for (uVar5 = 0; uVar5 < n_state_pm - 1; uVar5 = uVar5 + 1) {
        fVar7 = 1.0;
        if ((int)lVar2 != 0) {
          fVar7 = 0.0;
          for (uVar3 = 0; n_state_pm != uVar3; uVar3 = uVar3 + 1) {
            fVar7 = fVar7 + (float)tmat[uVar6][uVar5][uVar3];
          }
          if ((fVar7 == 0.0) && (!NAN(fVar7))) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
                    ,0x182,"tmat [%u][%u][*] zero\n",uVar6 & 0xffffffff,uVar5 & 0xffffffff);
            fVar7 = 1.0;
          }
        }
        local_44 = fVar7;
        for (uVar3 = 0; uVar3 < n_state_pm; uVar3 = uVar3 + 1) {
          if ((float)tmat[uVar6][uVar5][uVar3] <= 0.0) {
            printf(" %8s","");
          }
          else {
            printf(e_fmt_ld_sp,(double)((float)tmat[uVar6][uVar5][uVar3] / local_44));
          }
        }
        putchar(10);
        lVar2 = local_38;
      }
    }
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
print_tmat(const char *fn)
{
    float32 ***tmat;
    uint32 n_tmat;
    uint32 n_state_pm;
    uint32 i, j, k;
    int32 normalize = cmd_ln_int32("-norm");
    float32 sum;
    
    E_INFO("Reading %s%s\n",
	   (normalize ? " and normalizing." : "."),
	   fn);
    
    if (s3tmat_read(fn,
		    &tmat,
		    &n_tmat,
		    &n_state_pm) != S3_SUCCESS) {
	return S3_ERROR;
    }

    printf("tmat %u %u\n", n_tmat, n_state_pm);

    for (i = 0; i < n_tmat; i++) {
	printf("tmat [%u]\n", i);

	for (j = 0; j < n_state_pm-1; j++) {

	    if (normalize) {
		for (k = 0, sum = 0; k < n_state_pm; k++) {
		    sum += tmat[i][j][k];
		}

		if (sum == 0) {
		    E_WARN("tmat [%u][%u][*] zero\n", i, j);
		    sum = 1;
		}

	    }
	    else
		sum = 1;

	    for (k = 0; k < n_state_pm; k++) {
		if (tmat[i][j][k] > 0.0) {
		    printf(e_fmt_ld_sp, tmat[i][j][k]/sum);
		}
		else {
		    printf(" %8s", "");
		}
	    }
	    printf("\n");
	}
    }
    return S3_SUCCESS;
}